

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  uint8_t *puVar4;
  EpsCopyOutputStream *unaff_RBX;
  uint8_t *__src;
  int size;
  void *data;
  uint local_34;
  uint8_t *local_30;
  
  if (this->had_error_ == true) {
    Next((EpsCopyOutputStream *)&stack0xffffffffffffffd0);
LAB_002d3d94:
    unaff_RBX->had_error_ = true;
    __src = unaff_RBX->buffer_;
  }
  else {
    unaff_RBX = this;
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) goto LAB_002d3d94;
    puVar4 = this->end_;
    __src = this->buffer_;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      memcpy(this->buffer_end_,__src,(long)puVar4 - (long)__src);
      do {
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&stack0xffffffffffffffd0,&local_34);
        if ((char)iVar2 == '\0') {
          this->had_error_ = true;
          goto LAB_002d3d6e;
        }
        uVar3 = (ulong)local_34;
      } while (uVar3 == 0);
      if (0x10 < (int)local_34) {
        uVar1 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)local_30 = *(undefined8 *)this->end_;
        *(undefined8 *)(local_30 + 8) = uVar1;
        this->end_ = local_30 + (uVar3 - 0x10);
        this->buffer_end_ = (uint8_t *)0x0;
        return local_30;
      }
      if ((int)local_34 < 1) {
        Next((EpsCopyOutputStream *)&stack0xffffffffffffffd0);
      }
      uVar1 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)__src = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar1;
      this->buffer_end_ = local_30;
      puVar4 = __src + uVar3;
      goto LAB_002d3d72;
    }
    uVar1 = *(undefined8 *)(puVar4 + 8);
    *(undefined8 *)__src = *(undefined8 *)puVar4;
    *(undefined8 *)(this->buffer_ + 8) = uVar1;
    this->buffer_end_ = puVar4;
  }
LAB_002d3d6e:
  puVar4 = unaff_RBX->buffer_ + 0x10;
LAB_002d3d72:
  unaff_RBX->end_ = puVar4;
  return __src;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (ABSL_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (ABSL_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (ABSL_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}